

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_str_constraint.c
# Opt level: O0

constraint_handler_t set_str_constraint_handler_s(constraint_handler_t handler)

{
  constraint_handler_t p_Var1;
  constraint_handler_t prev_handler;
  constraint_handler_t handler_local;
  
  p_Var1 = str_handler;
  str_handler = handler;
  if (handler == (constraint_handler_t)0x0) {
    str_handler = ignore_handler_s;
  }
  return p_Var1;
}

Assistant:

constraint_handler_t
set_str_constraint_handler_s (constraint_handler_t handler)
{
    constraint_handler_t prev_handler = str_handler;
    if (NULL == handler) {
        str_handler = sl_default_handler;
    } else {
        str_handler = handler;
    }
    return prev_handler;
}